

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddCallback(ImDrawList *this,ImDrawCallback callback,void *callback_data)

{
  value_type *pvVar1;
  
  if ((this->CmdBuffer).Size != 0) {
    pvVar1 = ImVector<ImDrawCmd>::back(&this->CmdBuffer);
    if ((pvVar1->ElemCount == 0) && (pvVar1->UserCallback == (ImDrawCallback)0x0))
    goto LAB_001808db;
  }
  AddDrawCmd(this);
  pvVar1 = ImVector<ImDrawCmd>::back(&this->CmdBuffer);
LAB_001808db:
  pvVar1->UserCallback = callback;
  pvVar1->UserCallbackData = callback_data;
  AddDrawCmd(this);
  return;
}

Assistant:

void ImDrawList::AddCallback(ImDrawCallback callback, void* callback_data)
{
    ImDrawCmd* current_cmd = CmdBuffer.Size ? &CmdBuffer.back() : NULL;
    if (!current_cmd || current_cmd->ElemCount != 0 || current_cmd->UserCallback != NULL)
    {
        AddDrawCmd();
        current_cmd = &CmdBuffer.back();
    }
    current_cmd->UserCallback = callback;
    current_cmd->UserCallbackData = callback_data;

    AddDrawCmd(); // Force a new command after us (see comment below)
}